

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O2

void __thiscall r_comp::Decompiler::write_view(Decompiler *this,uint16_t read_index,uint16_t arity)

{
  ulong in_RAX;
  uint16_t j;
  ushort uVar1;
  ulong uStack_38;
  bool after_tail_wildcard;
  
  if ((ushort)(arity - 0xe) < 0xfff4) {
    OutStream::operator<<(this->out_stream,(char (*) [4])"nil");
    return;
  }
  uStack_38 = in_RAX & 0xffffffffffffff;
  OutStream::operator<<(this->out_stream,(char (*) [2])"[");
  for (uVar1 = 1; uVar1 <= arity; uVar1 = uVar1 + 1) {
    write_any(this,read_index + uVar1,&after_tail_wildcard,true,0);
    if (uVar1 < arity) {
      OutStream::operator<<(this->out_stream,(char (*) [2])0x146209);
    }
  }
  OutStream::operator<<(this->out_stream,(char (*) [2])0x146c68);
  return;
}

Assistant:

void Decompiler::write_view(uint16_t read_index, uint16_t arity)
{
    if (arity > VIEW_CODE_MAX_SIZE || arity <= 1) {
        *out_stream << "nil";
        return;
    }

    bool after_tail_wildcard = false;
    *out_stream << "[";

    for (uint16_t j = 1; j <= arity; ++j) {
        write_any(read_index + j, after_tail_wildcard, true);

        if (j < arity) {
            *out_stream << " ";
        }
    }

    *out_stream << "]";
}